

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

AndConstraint * __thiscall icu_63::OrConstraint::add(OrConstraint *this,UErrorCode *status)

{
  AndConstraint *pAVar1;
  UErrorCode UVar2;
  OrConstraint *pOVar3;
  
  UVar2 = this->fInternalStatus;
  if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
    do {
      pOVar3 = this;
      this = pOVar3->next;
    } while (this != (OrConstraint *)0x0);
    pAVar1 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)status);
    if (pAVar1 == (AndConstraint *)0x0) {
      pAVar1 = (AndConstraint *)0x0;
    }
    else {
      pAVar1->_vptr_AndConstraint = (_func_int **)0x0;
      pAVar1->op = NONE;
      pAVar1->opNum = 0;
      *(undefined8 *)&pAVar1->value = 0;
      pAVar1->rangeList = (UVector32 *)0x0;
      pAVar1->negated = '\0';
      pAVar1->integerOnly = '\0';
      *(undefined2 *)&pAVar1->field_0x22 = 0;
      pAVar1->digitsType = none;
      pAVar1->next = (AndConstraint *)0x0;
      *(undefined8 *)&pAVar1->fInternalStatus = 0;
      pAVar1->_vptr_AndConstraint = (_func_int **)&PTR__AndConstraint_003eb6e8;
      pAVar1->op = NONE;
      pAVar1->opNum = -1;
      pAVar1->value = -1;
      pAVar1->rangeList = (UVector32 *)0x0;
      pAVar1->negated = '\0';
      pAVar1->integerOnly = '\0';
      *(undefined8 *)&pAVar1->digitsType = 0;
      *(undefined8 *)((long)&pAVar1->next + 4) = 0;
    }
    pOVar3->childNode = pAVar1;
    if (pAVar1 != (AndConstraint *)0x0) {
      return pAVar1;
    }
    UVar2 = U_MEMORY_ALLOCATION_ERROR;
  }
  *status = UVar2;
  return (AndConstraint *)0x0;
}

Assistant:

AndConstraint*
OrConstraint::add(UErrorCode& status) {
    if (U_FAILURE(fInternalStatus)) {
        status = fInternalStatus;
        return nullptr;
    }
    OrConstraint *curOrConstraint=this;
    {
        while (curOrConstraint->next!=nullptr) {
            curOrConstraint = curOrConstraint->next;
        }
        U_ASSERT(curOrConstraint->childNode == nullptr);
        curOrConstraint->childNode = new AndConstraint();
        if (curOrConstraint->childNode == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
        }
    }
    return curOrConstraint->childNode;
}